

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int ly_set_add(ly_set *set,void *node,int options)

{
  uint uVar1;
  LY_ERR *pLVar2;
  lys_node **pplVar3;
  void **new;
  uint i;
  int options_local;
  void *node_local;
  ly_set *set_local;
  
  if ((set == (ly_set *)0x0) || (node == (void *)0x0)) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    set_local._4_4_ = -1;
  }
  else {
    if ((options & 1U) == 0) {
      for (new._0_4_ = 0; (uint)new < set->number; new._0_4_ = (uint)new + 1) {
        if ((set->set).s[(uint)new] == (lys_node *)node) {
          return (uint)new;
        }
      }
    }
    if (set->size == set->number) {
      pplVar3 = (lys_node **)realloc((set->set).s,(ulong)(set->size + 8) << 3);
      if (pplVar3 == (lys_node **)0x0) {
        pLVar2 = ly_errno_location();
        *pLVar2 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","ly_set_add");
        return -1;
      }
      set->size = set->size + 8;
      (set->set).s = pplVar3;
    }
    uVar1 = set->number;
    set->number = uVar1 + 1;
    (set->set).s[uVar1] = (lys_node *)node;
    set_local._4_4_ = set->number - 1;
  }
  return set_local._4_4_;
}

Assistant:

API int
ly_set_add(struct ly_set *set, void *node, int options)
{
    unsigned int i;
    void **new;

    if (!set || !node) {
        ly_errno = LY_EINVAL;
        return -1;
    }

    if (!(options & LY_SET_OPT_USEASLIST)) {
        /* search for duplication */
        for (i = 0; i < set->number; i++) {
            if (set->set.g[i] == node) {
                /* already in set */
                return i;
            }
        }
    }

    if (set->size == set->number) {
        new = realloc(set->set.g, (set->size + 8) * sizeof *(set->set.g));
        if (!new) {
            LOGMEM;
            return -1;
        }
        set->size += 8;
        set->set.g = new;
    }

    set->set.g[set->number++] = node;

    return set->number - 1;
}